

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console_Command.h
# Opt level: O1

void __thiscall
Generic_Command_As_Console_Command<JoinGenericCommand>::Generic_Command_As_Console_Command
          (Generic_Command_As_Console_Command<JoinGenericCommand> *this)

{
  long lVar1;
  undefined8 uVar2;
  long lVar3;
  
  ConsoleCommand::ConsoleCommand(&this->super_ConsoleCommand);
  *(undefined ***)this = &PTR_getHelp_00114a00;
  lVar3 = 0;
  while( true ) {
    lVar1 = Jupiter::Command::getTriggerCount();
    if (lVar3 == lVar1) break;
    uVar2 = Jupiter::Command::getTrigger((ulong)&JoinGenericCommand_instance);
    lVar3 = lVar3 + 1;
    Jupiter::Command::addTrigger(this,uVar2);
  }
  return;
}

Assistant:

Generic_Command_As_Console_Command<T>::Generic_Command_As_Console_Command() : ConsoleCommand() {
	size_t index = 0;
	while (index != T::instance.getTriggerCount()) {
		this->addTrigger(T::instance.getTrigger(index++));
	}
}